

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_set_covered_faces(Array<MultiFab_*,_3> *umac,Real val)

{
  double dVar1;
  int iVar2;
  BATType BVar3;
  bool bVar4;
  FabFactory<amrex::FArrayBox> *pFVar5;
  const_reference ppMVar6;
  EBCellFlagFab *this;
  undefined8 in_XMM0_Qa;
  int i_5;
  int j_5;
  int k_5;
  int n_5;
  Dim3 hi_5;
  Dim3 lo_5;
  Box tzbx_1;
  iterator __end5_2;
  iterator __begin5_2;
  range_impl<amrex::Box> *__range5_2;
  int i_4;
  int j_4;
  int k_4;
  int n_4;
  Dim3 hi_4;
  Dim3 lo_4;
  Box tybx_1;
  iterator __end5_1;
  iterator __begin5_1;
  range_impl<amrex::Box> *__range5_1;
  int i_3;
  int j_3;
  int k_3;
  int n_3;
  Dim3 hi_3;
  Dim3 lo_3;
  Box txbx_1;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<const_double> *az;
  Array4<const_double> *ay;
  Array4<const_double> *ax;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 hi_2;
  Dim3 lo_2;
  Box tzbx;
  iterator __end4_2;
  iterator __begin4_2;
  range_impl<amrex::Box> *__range4_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 hi_1;
  Dim3 lo_1;
  Box tybx;
  iterator __end4_1;
  iterator __begin4_1;
  range_impl<amrex::Box> *__range4_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  Box txbx;
  iterator __end4;
  iterator __begin4;
  range_impl<amrex::Box> *__range4;
  FabType fabtyp;
  Array4<double> *w;
  Array4<double> *v;
  Array4<double> *u;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  MFIter mfi;
  int ncomp;
  FabArray<amrex::EBCellFlagFab> *flags;
  Array<const_MultiCutFab_*,_3> *area;
  EBFArrayBoxFactory *factory;
  MFIter *in_stack_fffffffffffff288;
  MultiCutFab *in_stack_fffffffffffff290;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff298;
  undefined8 in_stack_fffffffffffff2b0;
  undefined1 do_tiling_;
  Box *pBVar7;
  FabArrayBase *in_stack_fffffffffffff2b8;
  MFIter *this_00;
  long local_d38;
  int local_d28;
  int local_d24;
  BATType local_d20;
  int local_d1c;
  undefined4 in_stack_fffffffffffff2f8;
  uint in_stack_fffffffffffff2fc;
  uint in_stack_fffffffffffff300;
  int in_stack_fffffffffffff304;
  undefined1 local_cdc [52];
  iterator local_ca8;
  undefined1 local_c90 [40];
  undefined1 *local_c68;
  int local_c60;
  int local_c5c;
  BATType local_c58;
  int local_c54;
  undefined8 local_c50;
  int local_c48;
  undefined8 local_c3c;
  int local_c34;
  _func_int **local_c30;
  BATType local_c28;
  _func_int **local_c20;
  BATType local_c18;
  undefined1 local_c14 [52];
  iterator local_be0;
  undefined1 local_bc8 [40];
  undefined1 *local_ba0;
  int local_b98;
  int local_b94;
  int local_b90;
  int local_b8c;
  Box local_b4c;
  iterator local_b30;
  iterator local_b18;
  undefined1 local_b00 [40];
  undefined1 *local_ad8;
  long local_ad0 [8];
  long *local_a90;
  long local_a88 [8];
  long *local_a48;
  long local_a40 [8];
  long *local_a00;
  int local_9f8;
  int local_9f4;
  int local_9f0;
  int local_9ec;
  Box local_9ac;
  iterator local_990;
  iterator local_978;
  undefined1 local_960 [40];
  undefined1 *local_938;
  int local_930;
  int local_92c;
  int local_928;
  int local_924;
  undefined8 local_920;
  int local_918;
  undefined8 local_90c;
  int local_904;
  undefined8 local_900;
  int local_8f8;
  undefined8 local_8f0;
  int local_8e8;
  Box local_8e4;
  iterator local_8c8;
  iterator local_8b0;
  undefined1 local_898 [40];
  undefined1 *local_870;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  undefined8 local_858;
  int local_850;
  undefined8 local_844;
  int local_83c;
  undefined8 local_838;
  int local_830;
  undefined8 local_828;
  int local_820;
  Box local_81c;
  iterator local_800;
  iterator local_7e8;
  undefined1 local_7d0 [40];
  undefined1 *local_7a8;
  FabType local_79c;
  long local_798 [8];
  long *local_758;
  long local_750 [8];
  long *local_710;
  long local_708 [8];
  long *local_6c8;
  int local_6c0 [2];
  int local_6b8;
  int local_6b0 [2];
  int local_6a8;
  undefined1 local_6a4 [28];
  undefined1 *local_688;
  undefined1 local_664 [28];
  undefined1 *local_648;
  int local_640 [2];
  int local_638;
  int local_630 [2];
  int local_628;
  undefined1 local_624 [28];
  undefined1 *local_608;
  MFIter local_600;
  int local_59c;
  FabArray<amrex::EBCellFlagFab> *local_598;
  undefined1 local_590 [24];
  undefined1 *local_578;
  long local_570;
  undefined8 local_568;
  _func_int **local_558;
  BATType local_550;
  MultiCutFab *local_548;
  int local_53c;
  int iStack_538;
  BATType local_534;
  _func_int **local_530;
  BATType local_528;
  FabArray<amrex::FArrayBox> *local_520;
  int local_514;
  int iStack_510;
  BATType local_50c;
  Box *local_4f8;
  Box *local_4d0;
  undefined8 local_4b8;
  int local_4b0;
  Box *local_4a8;
  int local_49c;
  int iStack_498;
  int local_494;
  undefined8 local_490;
  int local_488;
  Box *local_480;
  int local_474;
  int iStack_470;
  int local_46c;
  undefined8 local_468;
  int local_460;
  MultiCutFab *local_458;
  uint local_44c;
  uint uStack_448;
  int local_444;
  undefined8 local_440;
  int local_438;
  FabArray<amrex::FArrayBox> *local_430;
  uint local_424;
  uint uStack_420;
  int local_41c;
  Box *local_408;
  Box *local_3e0;
  undefined8 local_3c8;
  int local_3c0;
  Box *local_3b8;
  int local_3ac;
  int iStack_3a8;
  int local_3a4;
  undefined8 local_3a0;
  int local_398;
  Box *local_390;
  int local_384;
  int iStack_380;
  int local_37c;
  int local_378;
  BATType local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_360;
  BATType local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e8 [2];
  int local_2e0;
  undefined4 local_2d8;
  IntVect local_2d4 [2];
  undefined4 local_2b8;
  IntVect local_2b4;
  int local_2a8 [2];
  int local_2a0;
  undefined4 local_294;
  IntVect local_290;
  BATType local_284;
  int local_280;
  int local_27c;
  long *local_278;
  BATType local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_254;
  int local_250;
  int local_24c;
  long *local_248;
  undefined4 local_23c;
  IntVect *local_238;
  undefined4 local_22c;
  IntVect *local_228;
  undefined4 local_21c;
  IntVect *local_218;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  undefined4 local_1dc;
  IntVect *local_1d8;
  undefined4 local_1cc;
  IntVect *local_1c8;
  undefined4 local_1bc;
  IntVect *local_1b8;
  undefined4 local_1ac;
  IntVect *local_1a8;
  undefined4 local_19c;
  IntVect *local_198;
  undefined4 local_18c;
  IntVect *local_188;
  undefined4 local_17c;
  BATOp *local_178;
  undefined4 local_16c;
  BATOp *local_168;
  undefined4 local_15c;
  BATOp *local_158;
  undefined4 local_14c;
  BATOp *local_148;
  undefined4 local_13c;
  BATOp *local_138;
  undefined4 local_12c;
  BATOp *local_128;
  undefined4 local_11c;
  Box *local_118;
  undefined4 local_10c;
  Box *local_108;
  undefined4 local_fc;
  Box *local_f8;
  undefined4 local_ec;
  Box *local_e8;
  undefined4 local_dc;
  Box *local_d8;
  undefined4 local_cc;
  Box *local_c8;
  undefined4 local_bc;
  Box *local_b8;
  undefined4 local_ac;
  Box *local_a8;
  undefined4 local_9c;
  Box *local_98;
  undefined4 local_8c;
  Box *local_88;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  FabArray<amrex::FArrayBox> *local_58;
  undefined4 local_4c;
  FabArray<amrex::FArrayBox> *local_48;
  undefined4 local_3c;
  FabArray<amrex::FArrayBox> *local_38;
  undefined4 local_2c;
  MultiCutFab *local_28;
  undefined4 local_1c;
  MultiCutFab *local_18;
  undefined4 local_c;
  MultiCutFab *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff2b0 >> 0x38);
  local_568 = in_XMM0_Qa;
  std::array<amrex::MultiFab_*,_3UL>::operator[]
            ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff290,
             (size_type)in_stack_fffffffffffff288);
  pFVar5 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x13dfc01);
  if (pFVar5 == (FabFactory<amrex::FArrayBox> *)0x0) {
    local_d38 = 0;
  }
  else {
    local_d38 = __dynamic_cast(pFVar5,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo);
  }
  local_570 = local_d38;
  if (local_d38 != 0) {
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff290);
    local_578 = local_590;
    local_598 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff290);
    ppMVar6 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                        ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff290,
                         (size_type)in_stack_fffffffffffff288);
    local_59c = FabArrayBase::nComp((FabArrayBase *)*ppMVar6);
    ppMVar6 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                        ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff290,
                         (size_type)in_stack_fffffffffffff288);
    this_00 = (MFIter *)*ppMVar6;
    TilingIfNotGPU();
    MFIter::MFIter(this_00,in_stack_fffffffffffff2b8,(bool)do_tiling_);
    while (bVar4 = MFIter::isValid(&local_600), bVar4) {
      local_294 = 0;
      IntVect::IntVect(&local_290,1,0,0);
      local_2a0 = local_290.vect[2];
      local_2a8[0] = local_290.vect[0];
      local_2a8[1] = local_290.vect[1];
      local_638 = local_290.vect[2];
      local_640[0] = local_290.vect[0];
      local_640[1] = local_290.vect[1];
      local_630[0] = local_290.vect[0];
      local_630[1] = local_290.vect[1];
      local_628 = local_290.vect[2];
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                      (IntVect *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8));
      local_608 = local_624;
      local_2b8 = 1;
      IntVect::IntVect(&local_2b4,0,1,0);
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                      (IntVect *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8));
      local_648 = local_664;
      local_2d8 = 2;
      IntVect::IntVect(local_2d4,0,0,1);
      local_2e0 = local_2d4[0].vect[2];
      local_2e8[0] = local_2d4[0].vect[0];
      local_2e8[1] = local_2d4[0].vect[1];
      local_6b8 = local_2d4[0].vect[2];
      local_6c0[0] = local_2d4[0].vect[0];
      local_6c0[1] = local_2d4[0].vect[1];
      local_6b0[0] = local_2d4[0].vect[0];
      local_6b0[1] = local_2d4[0].vect[1];
      local_6a8 = local_2d4[0].vect[2];
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                      (IntVect *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8));
      local_688 = local_6a4;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff290,
                 (size_type)in_stack_fffffffffffff288);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff298,(MFIter *)in_stack_fffffffffffff290);
      local_6c8 = local_708;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff290,
                 (size_type)in_stack_fffffffffffff288);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff298,(MFIter *)in_stack_fffffffffffff290);
      local_710 = local_750;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff290,
                 (size_type)in_stack_fffffffffffff288);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff298,(MFIter *)in_stack_fffffffffffff290);
      local_758 = local_798;
      this = FabArray<amrex::EBCellFlagFab>::operator[]
                       ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff290,
                        in_stack_fffffffffffff288);
      local_79c = EBCellFlagFab::getType(this);
      if (local_79c == covered) {
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff290);
        local_7a8 = local_7d0;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        while (bVar4 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_7e8,&local_800), bVar4) {
          pBVar7 = &local_81c;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(pBVar7,&local_7e8);
          local_fc = 0;
          local_474 = (pBVar7->smallend).vect[0];
          local_10c = 1;
          iStack_470 = (pBVar7->smallend).vect[1];
          local_838 = *(undefined8 *)(pBVar7->smallend).vect;
          local_11c = 2;
          local_830 = (pBVar7->smallend).vect[2];
          local_218 = &pBVar7->bigend;
          local_21c = 0;
          local_384 = local_218->vect[0];
          local_228 = &pBVar7->bigend;
          local_22c = 1;
          iStack_380 = (pBVar7->bigend).vect[1];
          local_858 = *(undefined8 *)local_218->vect;
          local_238 = &pBVar7->bigend;
          local_23c = 2;
          local_850 = (pBVar7->bigend).vect[2];
          for (local_85c = 0; iVar2 = local_830, local_85c < local_59c; local_85c = local_85c + 1) {
            while (local_860 = iVar2, iVar2 = iStack_470, local_860 <= local_850) {
              while (local_864 = iVar2, iVar2 = local_474, local_864 <= iStack_380) {
                while (local_868 = iVar2, local_868 <= local_384) {
                  local_2f0 = local_6c8;
                  local_2f4 = local_868;
                  local_2f8 = local_864;
                  local_2fc = local_860;
                  local_300 = local_85c;
                  *(undefined8 *)
                   (*local_6c8 +
                   ((long)(local_868 - (int)local_6c8[4]) +
                    (long)(local_864 - *(int *)((long)local_6c8 + 0x24)) * local_6c8[1] +
                    (long)(local_860 - (int)local_6c8[5]) * local_6c8[2] +
                   (long)local_85c * local_6c8[3]) * 8) = local_568;
                  iVar2 = local_868 + 1;
                }
                iVar2 = local_864 + 1;
              }
              iVar2 = local_860 + 1;
            }
          }
          local_844 = local_858;
          local_83c = local_850;
          local_828 = local_838;
          local_820 = local_830;
          local_490 = local_838;
          local_488 = local_830;
          local_480 = pBVar7;
          local_46c = local_830;
          local_3a0 = local_858;
          local_398 = local_850;
          local_390 = pBVar7;
          local_37c = local_850;
          local_118 = pBVar7;
          local_108 = pBVar7;
          local_f8 = pBVar7;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_7e8);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff290);
        local_870 = local_898;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        while (bVar4 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_8b0,&local_8c8), bVar4) {
          pBVar7 = &local_8e4;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(pBVar7,&local_8b0);
          local_cc = 0;
          local_49c = (pBVar7->smallend).vect[0];
          local_dc = 1;
          iStack_498 = (pBVar7->smallend).vect[1];
          local_900 = *(undefined8 *)(pBVar7->smallend).vect;
          local_ec = 2;
          local_8f8 = (pBVar7->smallend).vect[2];
          local_1e8 = &pBVar7->bigend;
          local_1ec = 0;
          local_3ac = local_1e8->vect[0];
          local_1f8 = &pBVar7->bigend;
          local_1fc = 1;
          iStack_3a8 = (pBVar7->bigend).vect[1];
          local_920 = *(undefined8 *)local_1e8->vect;
          local_208 = &pBVar7->bigend;
          local_20c = 2;
          local_918 = (pBVar7->bigend).vect[2];
          for (local_924 = 0; iVar2 = local_8f8, local_924 < local_59c; local_924 = local_924 + 1) {
            while (local_928 = iVar2, iVar2 = iStack_498, local_928 <= local_918) {
              while (local_92c = iVar2, iVar2 = local_49c, local_92c <= iStack_3a8) {
                while (local_930 = iVar2, local_930 <= local_3ac) {
                  local_308 = local_710;
                  local_30c = local_930;
                  local_310 = local_92c;
                  local_314 = local_928;
                  local_318 = local_924;
                  *(undefined8 *)
                   (*local_710 +
                   ((long)(local_930 - (int)local_710[4]) +
                    (long)(local_92c - *(int *)((long)local_710 + 0x24)) * local_710[1] +
                    (long)(local_928 - (int)local_710[5]) * local_710[2] +
                   (long)local_924 * local_710[3]) * 8) = local_568;
                  iVar2 = local_930 + 1;
                }
                iVar2 = local_92c + 1;
              }
              iVar2 = local_928 + 1;
            }
          }
          local_90c = local_920;
          local_904 = local_918;
          local_8f0 = local_900;
          local_8e8 = local_8f8;
          local_4b8 = local_900;
          local_4b0 = local_8f8;
          local_4a8 = pBVar7;
          local_494 = local_8f8;
          local_3c8 = local_920;
          local_3c0 = local_918;
          local_3b8 = pBVar7;
          local_3a4 = local_918;
          local_e8 = pBVar7;
          local_d8 = pBVar7;
          local_c8 = pBVar7;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_8b0);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff290);
        local_938 = local_960;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        while (bVar4 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_978,&local_990), bVar4) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_9ac,&local_978);
          local_9c = 0;
          local_ac = 1;
          local_bc = 2;
          local_1b8 = &local_9ac.bigend;
          local_1bc = 0;
          local_1c8 = &local_9ac.bigend;
          local_1cc = 1;
          local_1d8 = &local_9ac.bigend;
          local_1dc = 2;
          for (local_9ec = 0; iVar2 = local_9ac.smallend.vect[2], local_9ec < local_59c;
              local_9ec = local_9ec + 1) {
            while (local_9f0 = iVar2, iVar2 = local_9ac.smallend.vect[1],
                  local_9f0 <= local_9ac.bigend.vect[2]) {
              while (local_9f4 = iVar2, iVar2 = local_9ac.smallend.vect[0],
                    local_9f4 <= local_9ac.bigend.vect[1]) {
                while (local_9f8 = iVar2, local_9f8 <= local_9ac.bigend.vect[0]) {
                  local_320 = local_758;
                  local_324 = local_9f8;
                  local_328 = local_9f4;
                  local_32c = local_9f0;
                  local_330 = local_9ec;
                  *(undefined8 *)
                   (*local_758 +
                   ((long)(local_9f8 - (int)local_758[4]) +
                    (long)(local_9f4 - *(int *)((long)local_758 + 0x24)) * local_758[1] +
                    (long)(local_9f0 - (int)local_758[5]) * local_758[2] +
                   (long)local_9ec * local_758[3]) * 8) = local_568;
                  iVar2 = local_9f8 + 1;
                }
                iVar2 = local_9f4 + 1;
              }
              iVar2 = local_9f0 + 1;
            }
          }
          local_4d0 = &local_9ac;
          local_3e0 = &local_9ac;
          local_b8 = &local_9ac;
          local_a8 = &local_9ac;
          local_98 = &local_9ac;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_978);
        }
      }
      else if (local_79c == singlevalued) {
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff290,
                   (size_type)in_stack_fffffffffffff288);
        MultiCutFab::const_array(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        local_a00 = local_a40;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff290,
                   (size_type)in_stack_fffffffffffff288);
        MultiCutFab::const_array(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        local_a48 = local_a88;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff290,
                   (size_type)in_stack_fffffffffffff288);
        MultiCutFab::const_array(in_stack_fffffffffffff290,in_stack_fffffffffffff288);
        local_a90 = local_ad0;
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff290);
        local_ad8 = local_b00;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        while (bVar4 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_b18,&local_b30), bVar4) {
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_b4c,&local_b18);
          local_6c = 0;
          local_7c = 1;
          local_8c = 2;
          local_188 = &local_b4c.bigend;
          local_18c = 0;
          local_198 = &local_b4c.bigend;
          local_19c = 1;
          local_1a8 = &local_b4c.bigend;
          local_1ac = 2;
          for (local_b8c = 0; iVar2 = local_b4c.smallend.vect[2], local_b8c < local_59c;
              local_b8c = local_b8c + 1) {
            while (local_b90 = iVar2, iVar2 = local_b4c.smallend.vect[1],
                  local_b90 <= local_b4c.bigend.vect[2]) {
              while (local_b94 = iVar2, iVar2 = local_b4c.smallend.vect[0],
                    local_b94 <= local_b4c.bigend.vect[1]) {
                while (local_b98 = iVar2, local_b98 <= local_b4c.bigend.vect[0]) {
                  local_248 = local_a00;
                  local_24c = local_b98;
                  local_250 = local_b94;
                  local_254 = local_b90;
                  dVar1 = *(double *)
                           (*local_a00 +
                           ((long)(local_b98 - (int)local_a00[4]) +
                            (long)(local_b94 - *(int *)((long)local_a00 + 0x24)) * local_a00[1] +
                           (long)(local_b90 - (int)local_a00[5]) * local_a00[2]) * 8);
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    local_338 = local_6c8;
                    local_33c = local_b98;
                    local_340 = local_b94;
                    local_344 = local_b90;
                    local_348 = local_b8c;
                    *(undefined8 *)
                     (*local_6c8 +
                     ((long)(local_b98 - (int)local_6c8[4]) +
                      (long)(local_b94 - *(int *)((long)local_6c8 + 0x24)) * local_6c8[1] +
                      (long)(local_b90 - (int)local_6c8[5]) * local_6c8[2] +
                     (long)local_b8c * local_6c8[3]) * 8) = local_568;
                  }
                  iVar2 = local_b98 + 1;
                }
                iVar2 = local_b94 + 1;
              }
              iVar2 = local_b90 + 1;
            }
          }
          local_4f8 = &local_b4c;
          local_408 = &local_b4c;
          local_88 = &local_b4c;
          local_78 = &local_b4c;
          local_68 = &local_b4c;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_b18);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff290);
        local_ba0 = local_bc8;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        while (bVar4 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_be0,(iterator *)(local_c14 + 0x1c)), bVar4) {
          in_stack_fffffffffffff298 = (FabArray<amrex::FArrayBox> *)local_c14;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)in_stack_fffffffffffff298,&local_be0);
          local_3c = 0;
          local_514 = *(int *)&(in_stack_fffffffffffff298->super_FabArrayBase)._vptr_FabArrayBase;
          local_4c = 1;
          iStack_510 = *(int *)((long)&(in_stack_fffffffffffff298->super_FabArrayBase).
                                       _vptr_FabArrayBase + 4);
          local_c30 = (in_stack_fffffffffffff298->super_FabArrayBase)._vptr_FabArrayBase;
          local_5c = 2;
          local_c28 = (in_stack_fffffffffffff298->super_FabArrayBase).boxarray.m_bat.m_bat_type;
          local_158 = &(in_stack_fffffffffffff298->super_FabArrayBase).boxarray.m_bat.m_op;
          local_15c = 0;
          local_424 = (local_158->m_indexType).m_typ.itype;
          local_168 = &(in_stack_fffffffffffff298->super_FabArrayBase).boxarray.m_bat.m_op;
          local_16c = 1;
          uStack_420 = (in_stack_fffffffffffff298->super_FabArrayBase).boxarray.m_bat.m_op.
                       m_bndryReg.m_typ.itype;
          local_c50 = *(undefined8 *)local_158;
          local_178 = &(in_stack_fffffffffffff298->super_FabArrayBase).boxarray.m_bat.m_op;
          local_17c = 2;
          local_c48 = (in_stack_fffffffffffff298->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg
                      .m_crse_ratio.vect[0];
          for (local_c54 = 0; BVar3 = local_c28, local_c54 < local_59c; local_c54 = local_c54 + 1) {
            while (local_c58 = BVar3, iVar2 = iStack_510, (int)local_c58 <= local_c48) {
              while (local_c5c = iVar2, iVar2 = local_514, local_c5c <= (int)uStack_420) {
                while (local_c60 = iVar2, local_c60 <= (int)local_424) {
                  local_260 = local_a48;
                  local_264 = local_c60;
                  local_268 = local_c5c;
                  local_26c = local_c58;
                  dVar1 = *(double *)
                           (*local_a48 +
                           ((long)(local_c60 - (int)local_a48[4]) +
                            (long)(local_c5c - *(int *)((long)local_a48 + 0x24)) * local_a48[1] +
                           (long)(int)(local_c58 - (int)local_a48[5]) * local_a48[2]) * 8);
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    local_350 = local_710;
                    local_354 = local_c60;
                    local_358 = local_c5c;
                    local_35c = local_c58;
                    local_360 = local_c54;
                    *(undefined8 *)
                     (*local_710 +
                     ((long)(local_c60 - (int)local_710[4]) +
                      (long)(local_c5c - *(int *)((long)local_710 + 0x24)) * local_710[1] +
                      (long)(int)(local_c58 - (int)local_710[5]) * local_710[2] +
                     (long)local_c54 * local_710[3]) * 8) = local_568;
                  }
                  iVar2 = local_c60 + 1;
                }
                iVar2 = local_c5c + 1;
              }
              BVar3 = local_c58 + indexType;
            }
          }
          local_c3c = local_c50;
          local_c34 = local_c48;
          local_c20 = local_c30;
          local_c18 = local_c28;
          local_530 = local_c30;
          local_528 = local_c28;
          local_520 = in_stack_fffffffffffff298;
          local_50c = local_c28;
          local_440 = local_c50;
          local_438 = local_c48;
          local_430 = in_stack_fffffffffffff298;
          local_41c = local_c48;
          local_58 = in_stack_fffffffffffff298;
          local_48 = in_stack_fffffffffffff298;
          local_38 = in_stack_fffffffffffff298;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_be0);
        }
        Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffff290);
        local_c68 = local_c90;
        Gpu::range_detail::range_impl<amrex::Box>::begin
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        Gpu::range_detail::range_impl<amrex::Box>::end
                  ((range_impl<amrex::Box> *)in_stack_fffffffffffff290);
        while (bVar4 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                 (&local_ca8,(iterator *)(local_cdc + 0x1c)), bVar4) {
          in_stack_fffffffffffff290 = (MultiCutFab *)local_cdc;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                    ((Box *)in_stack_fffffffffffff290,&local_ca8);
          local_c = 0;
          local_53c = *(int *)&(in_stack_fffffffffffff290->m_data).super_FabArrayBase.
                               _vptr_FabArrayBase;
          local_1c = 1;
          iStack_538 = *(int *)((long)&(in_stack_fffffffffffff290->m_data).super_FabArrayBase.
                                       _vptr_FabArrayBase + 4);
          local_558 = (in_stack_fffffffffffff290->m_data).super_FabArrayBase._vptr_FabArrayBase;
          local_2c = 2;
          local_550 = (in_stack_fffffffffffff290->m_data).super_FabArrayBase.boxarray.m_bat.
                      m_bat_type;
          local_128 = &(in_stack_fffffffffffff290->m_data).super_FabArrayBase.boxarray.m_bat.m_op;
          local_12c = 0;
          in_stack_fffffffffffff2fc = (local_128->m_indexType).m_typ.itype;
          local_138 = &(in_stack_fffffffffffff290->m_data).super_FabArrayBase.boxarray.m_bat.m_op;
          local_13c = 1;
          in_stack_fffffffffffff300 =
               (in_stack_fffffffffffff290->m_data).super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
               .m_typ.itype;
          local_468 = *(undefined8 *)local_128;
          local_148 = &(in_stack_fffffffffffff290->m_data).super_FabArrayBase.boxarray.m_bat.m_op;
          local_14c = 2;
          in_stack_fffffffffffff304 =
               (in_stack_fffffffffffff290->m_data).super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
               .m_crse_ratio.vect[0];
          for (local_d1c = 0; local_d20 = local_550, local_d1c < local_59c;
              local_d1c = local_d1c + 1) {
            for (; local_d24 = iStack_538, (int)local_d20 <= in_stack_fffffffffffff304;
                local_d20 = local_d20 + indexType) {
              for (; local_d28 = local_53c, local_d24 <= (int)in_stack_fffffffffffff300;
                  local_d24 = local_d24 + 1) {
                for (; local_d28 <= (int)in_stack_fffffffffffff2fc; local_d28 = local_d28 + 1) {
                  local_278 = local_a90;
                  local_27c = local_d28;
                  local_280 = local_d24;
                  local_284 = local_d20;
                  dVar1 = *(double *)
                           (*local_a90 +
                           ((long)(local_d28 - (int)local_a90[4]) +
                            (long)(local_d24 - *(int *)((long)local_a90 + 0x24)) * local_a90[1] +
                           (long)(int)(local_d20 - (int)local_a90[5]) * local_a90[2]) * 8);
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    local_368 = local_758;
                    local_36c = local_d28;
                    local_370 = local_d24;
                    local_374 = local_d20;
                    local_378 = local_d1c;
                    *(undefined8 *)
                     (*local_758 +
                     ((long)(local_d28 - (int)local_758[4]) +
                      (long)(local_d24 - *(int *)((long)local_758 + 0x24)) * local_758[1] +
                      (long)(int)(local_d20 - (int)local_758[5]) * local_758[2] +
                     (long)local_d1c * local_758[3]) * 8) = local_568;
                  }
                }
              }
            }
          }
          local_548 = in_stack_fffffffffffff290;
          local_534 = local_550;
          local_460 = in_stack_fffffffffffff304;
          local_458 = in_stack_fffffffffffff290;
          local_44c = in_stack_fffffffffffff2fc;
          uStack_448 = in_stack_fffffffffffff300;
          local_444 = in_stack_fffffffffffff304;
          local_28 = in_stack_fffffffffffff290;
          local_18 = in_stack_fffffffffffff290;
          local_8 = in_stack_fffffffffffff290;
          Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_ca8);
        }
      }
      MFIter::operator++(&local_600);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffff290);
  }
  return;
}

Assistant:

void
EB_set_covered_faces (const Array<MultiFab*,AMREX_SPACEDIM>& umac, Real val)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(umac[0]->Factory()));
    if (factory == nullptr) return;

    const auto& area = factory->getAreaFrac();
    const auto& flags = factory->getMultiEBCellFlagFab();
    const int ncomp = umac[0]->nComp();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*umac[0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.tilebox(IntVect::TheDimensionVector(0));,
                     const Box& ybx = mfi.tilebox(IntVect::TheDimensionVector(1));,
                     const Box& zbx = mfi.tilebox(IntVect::TheDimensionVector(2)));
        AMREX_D_TERM(Array4<Real> const& u = umac[0]->array(mfi);,
                     Array4<Real> const& v = umac[1]->array(mfi);,
                     Array4<Real> const& w = umac[2]->array(mfi));

        auto fabtyp = flags[mfi].getType();
        if (fabtyp == FabType::covered)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            u(i,j,k,n) = val;
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            v(i,j,k,n) = val;
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            w(i,j,k,n) = val;
                        }}}
                    }
                }
            );
        }
        else if (fabtyp == FabType::singlevalued)
        {
            AMREX_D_TERM(Array4<Real const> const& ax = area[0]->const_array(mfi);,
                         Array4<Real const> const& ay = area[1]->const_array(mfi);,
                         Array4<Real const> const& az = area[2]->const_array(mfi));
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ax(i,j,k) == 0.0) u(i,j,k,n) = val;
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ay(i,j,k) == 0.0) v(i,j,k,n) = val;
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (az(i,j,k) == 0.0) w(i,j,k,n) = val;
                        }}}
                    }
                }
            );
        }
    }
}